

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

void MaxDiffsForRow(int width,int stride,uint32_t *argb,uint8_t *max_diffs,int used_subtract_green)

{
  uint32_t argb_00;
  uint32_t argb_01;
  uint32_t argb_02;
  uint32_t argb_03;
  uint32_t argb_04;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if (2 < width) {
    argb_00 = *argb;
    argb_01 = argb[1];
    if (used_subtract_green != 0) {
      argb_00 = AddGreenToBlueAndRed(argb_00);
      argb_01 = AddGreenToBlueAndRed(argb_01);
    }
    for (uVar5 = 1; uVar5 < width - 1; uVar5 = uVar5 + 1) {
      argb_02 = argb[(int)uVar5 - stride];
      argb_03 = argb[(long)stride + uVar5];
      argb_04 = argb[uVar5 + 1];
      if (used_subtract_green != 0) {
        argb_02 = AddGreenToBlueAndRed(argb_02);
        argb_03 = AddGreenToBlueAndRed(argb_03);
        argb_04 = AddGreenToBlueAndRed(argb_04);
      }
      iVar1 = MaxDiffBetweenPixels(argb_01,argb_02);
      iVar2 = MaxDiffBetweenPixels(argb_01,argb_03);
      iVar3 = MaxDiffBetweenPixels(argb_01,argb_00);
      iVar4 = MaxDiffBetweenPixels(argb_01,argb_04);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      max_diffs[uVar5] = (uint8_t)iVar4;
      argb_00 = argb_01;
      argb_01 = argb_04;
    }
  }
  return;
}

Assistant:

static void MaxDiffsForRow(int width, int stride, const uint32_t* const argb,
                           uint8_t* const max_diffs, int used_subtract_green) {
  uint32_t current, up, down, left, right;
  int x;
  if (width <= 2) return;
  current = argb[0];
  right = argb[1];
  if (used_subtract_green) {
    current = AddGreenToBlueAndRed(current);
    right = AddGreenToBlueAndRed(right);
  }
  // max_diffs[0] and max_diffs[width - 1] are never used.
  for (x = 1; x < width - 1; ++x) {
    up = argb[-stride + x];
    down = argb[stride + x];
    left = current;
    current = right;
    right = argb[x + 1];
    if (used_subtract_green) {
      up = AddGreenToBlueAndRed(up);
      down = AddGreenToBlueAndRed(down);
      right = AddGreenToBlueAndRed(right);
    }
    max_diffs[x] = MaxDiffAroundPixel(current, up, down, left, right);
  }
}